

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBucket::VerifyMark(LargeHeapBucket *this)

{
  LargeHeapBlock *pLVar1;
  LargeHeapBlock **ppLVar2;
  
  ppLVar2 = &this->largeBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::VerifyMark(pLVar1);
    ppLVar2 = &pLVar1->next;
  }
  ppLVar2 = &this->fullLargeBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::VerifyMark(pLVar1);
    ppLVar2 = &pLVar1->next;
  }
  ppLVar2 = &this->pendingDisposeLargeBlockList;
  while (pLVar1 = *ppLVar2, pLVar1 != (LargeHeapBlock *)0x0) {
    LargeHeapBlock::VerifyMark(pLVar1);
    ppLVar2 = &pLVar1->next;
  }
  return;
}

Assistant:

void
LargeHeapBucket::VerifyMark()
{
    HeapBlockList::ForEach(largeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(fullLargeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
}